

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O3

Vta_Obj_t * Vga_ManFindOrAdd(Vta_Man_t *p,int iObj,int iFrame)

{
  int iVar1;
  uint uVar2;
  Vta_Obj_t *pVVar3;
  int *piVar4;
  int *piVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  
  if ((iObj < 0) || (iFrame < -1)) {
    __assert_fail("iObj >= 0 && iFrame >= -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                  ,0x125,"Vta_Obj_t *Vga_ManFindOrAdd(Vta_Man_t *, int, int)");
  }
  uVar9 = p->nObjs;
  if (uVar9 == p->nObjsAlloc) {
    if (p->pObjs == (Vta_Obj_t *)0x0) {
      pVVar3 = (Vta_Obj_t *)malloc((long)(int)uVar9 << 5);
    }
    else {
      pVVar3 = (Vta_Obj_t *)realloc(p->pObjs,(long)(int)uVar9 << 5);
      uVar9 = p->nObjsAlloc;
    }
    p->pObjs = pVVar3;
    memset(pVVar3 + (int)uVar9,0,(long)(int)uVar9 * 0x10);
    p->nObjsAlloc = uVar9 * 2;
    if (p->pBins != (int *)0x0) {
      free(p->pBins);
    }
    uVar9 = p->nBins * 2 - 1;
    while( true ) {
      do {
        uVar6 = uVar9 + 1;
        uVar2 = uVar9 & 1;
        uVar9 = uVar6;
      } while (uVar2 != 0);
      if (uVar6 < 9) break;
      iVar7 = 5;
      while (uVar6 % (iVar7 - 2U) != 0) {
        uVar2 = iVar7 * iVar7;
        iVar7 = iVar7 + 2;
        if (uVar6 < uVar2) goto LAB_0062ccde;
      }
    }
LAB_0062ccde:
    p->nBins = uVar6;
    piVar4 = (int *)calloc((long)(int)uVar6,4);
    p->pBins = piVar4;
    uVar9 = p->nObjs;
    uVar10 = (ulong)uVar9;
    if (1 < (int)uVar9) {
      pVVar3 = p->pObjs;
      lVar8 = 1;
      do {
        pVVar3[lVar8].iNext = 0;
        iVar7 = pVVar3[lVar8].iObj;
        iVar1 = pVVar3[lVar8].iFrame;
        uVar2 = (uint)((iVar1 + iVar7 + 1) * (iVar1 + iVar7)) % (uint)p->nBins;
        uVar9 = piVar4[(int)uVar2];
        if (((int)uVar9 < 0) || ((int)uVar10 <= (int)uVar9)) goto LAB_0062ce40;
        if (uVar9 == 0) {
          piVar5 = piVar4 + (int)uVar2;
        }
        else {
          do {
            uVar2 = uVar9;
            if ((pVVar3[uVar2].iObj == iVar7) && (pVVar3[uVar2].iFrame == iVar1)) {
              __assert_fail("*pPlace == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                            ,0x134,"Vta_Obj_t *Vga_ManFindOrAdd(Vta_Man_t *, int, int)");
            }
            uVar9 = pVVar3[uVar2].iNext;
            if (((int)uVar9 < 0) || ((int)uVar10 <= (int)uVar9)) goto LAB_0062ce40;
          } while (uVar9 != 0);
          piVar5 = &pVVar3[uVar2].iNext;
        }
        *piVar5 = (int)lVar8;
        lVar8 = lVar8 + 1;
        uVar9 = p->nObjs;
        uVar10 = (ulong)(int)uVar9;
      } while (lVar8 < (long)uVar10);
    }
  }
  else {
    piVar4 = p->pBins;
  }
  uVar6 = (uint)((iFrame + iObj + 1) * (iFrame + iObj)) % (uint)p->nBins;
  uVar2 = piVar4[(int)uVar6];
  if ((-1 < (int)uVar2) && ((int)uVar2 < (int)uVar9)) {
    if (uVar2 == 0) {
      piVar4 = piVar4 + (int)uVar6;
    }
    else {
      pVVar3 = p->pObjs;
      do {
        uVar6 = uVar2;
        if ((pVVar3[uVar6].iObj == iObj) && (pVVar3[uVar6].iFrame == iFrame)) {
          if ((int)uVar6 < (int)uVar9) {
            return p->pObjs + uVar6;
          }
          goto LAB_0062ce40;
        }
        uVar2 = pVVar3[uVar6].iNext;
        if (((int)uVar2 < 0) || ((int)uVar9 <= (int)uVar2)) goto LAB_0062ce40;
      } while (uVar2 != 0);
      piVar4 = &pVVar3[uVar6].iNext;
    }
    p->nObjs = uVar9 + 1;
    *piVar4 = uVar9;
    if ((int)uVar9 < p->nObjs) {
      pVVar3 = p->pObjs;
      pVVar3[uVar9].iObj = iObj;
      pVVar3[uVar9].iFrame = iFrame;
      return pVVar3 + uVar9;
    }
  }
LAB_0062ce40:
  __assert_fail("i >= 0 && i < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                ,0x68,"Vta_Obj_t *Vta_ManObj(Vta_Man_t *, int)");
}

Assistant:

static inline Vta_Obj_t * Vga_ManFindOrAdd( Vta_Man_t * p, int iObj, int iFrame )
{
    Vta_Obj_t * pThis;
    int i, * pPlace;
    assert( iObj >= 0 && iFrame >= -1 );
    if ( p->nObjs == p->nObjsAlloc )
    {
        // resize objects
        p->pObjs = ABC_REALLOC( Vta_Obj_t, p->pObjs, 2 * p->nObjsAlloc );
        memset( p->pObjs + p->nObjsAlloc, 0, p->nObjsAlloc * sizeof(Vta_Obj_t) );
        p->nObjsAlloc *= 2;
        // rehash entries in the table
        ABC_FREE( p->pBins );
        p->nBins = Abc_PrimeCudd( 2 * p->nBins );
        p->pBins = ABC_CALLOC( int, p->nBins );
        Vta_ManForEachObj( p, pThis, i )
        {
            pThis->iNext = 0;
            pPlace = Vga_ManLookup( p, pThis->iObj, pThis->iFrame );
            assert( *pPlace == 0 );
            *pPlace = i;
        }
    }
    pPlace = Vga_ManLookup( p, iObj, iFrame );
    if ( *pPlace )
        return Vta_ManObj(p, *pPlace);
    *pPlace = p->nObjs++;
    pThis = Vta_ManObj(p, *pPlace);
    pThis->iObj   = iObj;
    pThis->iFrame = iFrame;
    return pThis;
}